

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPlumeRecord.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GaussianPlumeRecord::Encode(GaussianPlumeRecord *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  KDataStream::Write<unsigned_short>(stream,(this->super_EnvironmentRecord).m_ui16Length);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Index);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Padding);
  (*(this->m_SrcLocation).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_SrcLocation,stream);
  (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Ori,stream);
  (*(this->m_PlumeLWH).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_PlumeLWH,stream);
  (*(this->m_DDTLEH).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_DDTLEH,stream);
  KDataStream::Write<float>(stream,(float)this->m_f32LdEdgeCenHght);
  (*(this->m_LdEdgeVel).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_LdEdgeVel,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Padding);
  return;
}

Assistant:

void GaussianPlumeRecord::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_SrcLocation
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_PlumeLWH
           << KDIS_STREAM m_DDTLEH
           << m_f32LdEdgeCenHght
           << KDIS_STREAM m_LdEdgeVel
           << m_ui32Padding;
}